

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMatterMeshless::IntStateGather
          (ChMatterMeshless *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  double *pdVar1;
  long lVar2;
  pointer psVar3;
  pointer psVar4;
  double *pdVar5;
  long lVar6;
  element_type *peVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  pointer psVar12;
  ulong uVar13;
  ulong uVar14;
  
  psVar12 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar12) {
    pdVar1 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar2 = (x->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    psVar3 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pdVar5 = (v->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar6 = (v->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    uVar13 = 0;
    uVar14 = (ulong)off_x;
    uVar10 = off_v;
    do {
      iVar8 = (int)uVar13 * 3;
      uVar9 = (ulong)(off_x + iVar8);
      if (lVar2 + -3 < (long)uVar9) {
LAB_006255dc:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar11 = 3;
      if ((((ulong)(pdVar1 + uVar9) & 7) == 0) &&
         (uVar11 = (ulong)(-((uint)((ulong)(pdVar1 + uVar9) >> 3) & 0x1fffffff) & 7), 2 < uVar11)) {
        uVar11 = 3;
      }
      peVar7 = psVar12[uVar13].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar11 != 0) {
        uVar9 = 0;
        do {
          pdVar1[uVar14 + uVar9] = (peVar7->super_ChNodeXYZ).pos.m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      if (uVar11 < 3) {
        do {
          pdVar1[uVar14 + uVar11] = (peVar7->super_ChNodeXYZ).pos.m_data[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      uVar9 = (ulong)(iVar8 + off_v);
      if (lVar6 + -3 < (long)uVar9) goto LAB_006255dc;
      uVar11 = 3;
      if ((((ulong)(pdVar5 + uVar9) & 7) == 0) &&
         (uVar11 = (ulong)(-((uint)((ulong)(pdVar5 + uVar9) >> 3) & 0x1fffffff) & 7), 2 < uVar11)) {
        uVar11 = 3;
      }
      peVar7 = psVar3[uVar13].
               super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar11 != 0) {
        uVar9 = 0;
        do {
          pdVar5[uVar10 + uVar9] = (peVar7->super_ChNodeXYZ).pos_dt.m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      if (uVar11 < 3) {
        do {
          pdVar5[uVar10 + uVar11] = (peVar7->super_ChNodeXYZ).pos_dt.m_data[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      uVar14 = (ulong)((int)uVar14 + 3);
      uVar10 = uVar10 + 3;
      psVar12 = psVar3;
    } while (uVar13 < (ulong)((long)psVar4 - (long)psVar3 >> 4));
  }
  *T = (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj.ChTime;
  return;
}

Assistant:

void ChMatterMeshless::IntStateGather(const unsigned int off_x,  // offset in x state vector
                                      ChState& x,                // state vector, position part
                                      const unsigned int off_v,  // offset in v state vector
                                      ChStateDelta& v,           // state vector, speed part
                                      double& T                  // time
                                      ) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        x.segment(off_x + 3 * j, 3) = nodes[j]->pos.eigen();
        v.segment(off_v + 3 * j, 3) = nodes[j]->pos_dt.eigen();
    }
    T = GetChTime();
}